

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml.cpp
# Opt level: O1

LanguagePtr Omega_h::xml::ask_language(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Language *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  LanguagePtr LVar2;
  
  if (ask_language()::ptr == '\0') {
    ask_language();
    in_RDX._M_pi = extraout_RDX_00;
  }
  if ((ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count == 0)) {
    __p = (Language *)operator_new(0x30);
    build_language();
    std::__shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>::reset<Omega_h::Language>
              (&ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>,
               __p);
    in_RDX._M_pi = extraout_RDX;
  }
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  _Var1 = ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)ask_language::ptr.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (LanguagePtr)LVar2.super___shared_ptr<Omega_h::Language,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LanguagePtr ask_language() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static LanguagePtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    ptr.reset(new Language(build_language()));
  }
  return ptr;
}